

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFreeValidCtxt(xmlSchematronValidCtxtPtr ctxt)

{
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchematronValidCtxtPtr)0x0) {
    if (ctxt->xctxt != (xmlXPathContextPtr_conflict)0x0) {
      xmlXPathFreeContext(ctxt->xctxt);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlSchematronFreeValidCtxt(xmlSchematronValidCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->xctxt != NULL)
        xmlXPathFreeContext(ctxt->xctxt);
    if (ctxt->dict != NULL)
        xmlDictFree(ctxt->dict);
    xmlFree(ctxt);
}